

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

int read_binary_data(T1_Parser parser,FT_ULong *size,FT_Byte **base,FT_Bool incremental)

{
  byte *pbVar1;
  byte *pbVar2;
  FT_ULong FVar3;
  FT_Long s;
  FT_Byte *limit;
  FT_Byte *cur;
  FT_Bool incremental_local;
  FT_Byte **base_local;
  FT_ULong *size_local;
  T1_Parser parser_local;
  
  pbVar1 = (parser->root).limit;
  (*(parser->root).funcs.skip_spaces)(&parser->root);
  pbVar2 = (parser->root).cursor;
  if ((pbVar2 < pbVar1) && (*pbVar2 - 0x30 < 10)) {
    FVar3 = (*(parser->root).funcs.to_int)(&parser->root);
    (*(parser->root).funcs.skip_PS_token)(&parser->root);
    *base = (parser->root).cursor + 1;
    if ((-1 < (long)FVar3) && ((long)FVar3 < (long)pbVar1 - (long)*base)) {
      (parser->root).cursor = (parser->root).cursor + FVar3 + 1;
      *size = FVar3;
      return (uint)(((parser->root).error != 0 ^ 0xffU) & 1);
    }
  }
  if (incremental == '\0') {
    (parser->root).error = 3;
  }
  return 0;
}

Assistant:

static int
  read_binary_data( T1_Parser  parser,
                    FT_ULong*  size,
                    FT_Byte**  base,
                    FT_Bool    incremental )
  {
    FT_Byte*  cur;
    FT_Byte*  limit = parser->root.limit;


    /* the binary data has one of the following formats */
    /*                                                  */
    /*   `size' [white*] RD white ....... ND            */
    /*   `size' [white*] -| white ....... |-            */
    /*                                                  */

    T1_Skip_Spaces( parser );

    cur = parser->root.cursor;

    if ( cur < limit && ft_isdigit( *cur ) )
    {
      FT_Long  s = T1_ToInt( parser );


      T1_Skip_PS_Token( parser );   /* `RD' or `-|' or something else */

      /* there is only one whitespace char after the */
      /* `RD' or `-|' token                          */
      *base = parser->root.cursor + 1;

      if ( s >= 0 && s < limit - *base )
      {
        parser->root.cursor += s + 1;
        *size = (FT_ULong)s;
        return !parser->root.error;
      }
    }

    if( !incremental )
    {
      FT_ERROR(( "read_binary_data: invalid size field\n" ));
      parser->root.error = FT_THROW( Invalid_File_Format );
    }

    return 0;
  }